

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O2

void __thiscall
sparse_square_matrix<unsigned_char>::set
          (sparse_square_matrix<unsigned_char> *this,uint32_t i,uint32_t j,uchar *value)

{
  mapped_type mVar1;
  uint uVar2;
  pointer puVar3;
  mapped_type *pmVar4;
  char *__assertion;
  ulong local_18;
  
  uVar2 = this->N;
  if (i < uVar2) {
    if (j < uVar2) {
      puVar3 = (this->denseStorage).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      mVar1 = *value;
      if (puVar3 == (this->denseStorage).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        local_18 = (ulong)(uVar2 * i + j);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->sparseStorage,&local_18);
        *pmVar4 = mVar1;
      }
      else {
        puVar3[uVar2 * i + j] = mVar1;
      }
      return;
    }
    __assertion = "j < N";
    uVar2 = 0x30;
  }
  else {
    __assertion = "i < N";
    uVar2 = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                ,uVar2,
                "void sparse_square_matrix<unsigned char>::set(uint32_t, uint32_t, const Ty &) [Ty = unsigned char]"
               );
}

Assistant:

void set(uint32_t i, uint32_t j, const Ty& value) {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      denseStorage[i * N + j] = value;
    } else {
      sparseStorage[i * N + j] = value;
    }
  }